

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmpool.cpp
# Opt level: O2

void __thiscall
CVmPoolPaged::attach_backing_store(CVmPoolPaged *this,CVmPoolBackingStore *backing_store)

{
  int iVar1;
  undefined4 extraout_var;
  size_t nslots;
  ulong uVar2;
  
  delete_page_list(this);
  *(CVmPoolBackingStore **)&this->field_0x10 = backing_store;
  iVar1 = (*backing_store->_vptr_CVmPoolBackingStore[3])(backing_store);
  uVar2 = 0x400;
  if (CONCAT44(extraout_var,iVar1) != 0) {
    uVar2 = CONCAT44(extraout_var,iVar1);
  }
  *(ulong *)&this->field_0x8 = uVar2;
  iVar1 = 0;
  for (; (uVar2 & 1) == 0; uVar2 = uVar2 >> 1) {
    iVar1 = iVar1 + 1;
  }
  if (uVar2 == 1) {
    this->log2_page_size_ = iVar1;
    nslots = (**(code **)(**(long **)&this->field_0x10 + 0x10))();
    alloc_page_slots(this,nslots);
    return;
  }
  err_throw(0xcc);
}

Assistant:

void CVmPoolPaged::attach_backing_store(CVmPoolBackingStore *backing_store)
{
    size_t cur;
    size_t log2;

    /* delete any existing page list */
    delete_page_list();

    /* inherit default handling */
    CVmPool::attach_backing_store(backing_store);

    /* 
     *   if the page size is zero, there must not be any pages at all -
     *   use a dummy default page size
     */
    if (page_size_ == 0)
        page_size_ = 1024;

    /*
     *   Compute log2 of the page size.  If the page size isn't a power of
     *   two, throw an error. 
     */
    for (cur = page_size_, log2 = 0 ; (cur & 1) == 0 ; cur >>= 1, ++log2) ;
    if (cur != 1)
        err_throw(VMERR_BAD_POOL_PAGE_SIZE);

    /* store log2(page_size_) in log2_page_size_ */
    log2_page_size_ = log2;

    /* allocate the pages */
    alloc_page_slots(backing_store_->vmpbs_get_page_count());
}